

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Job.cpp
# Opt level: O1

void __thiscall xmrig::Job::move(Job *this,Job *other)

{
  uint64_t uVar1;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  byte bVar5;
  
  bVar5 = 0;
  this->m_size = other->m_size;
  String::move(&this->m_clientId,&other->m_clientId);
  String::move(&this->m_id,&other->m_id);
  this->m_backend = other->m_backend;
  uVar1 = other->m_height;
  this->m_diff = other->m_diff;
  this->m_height = uVar1;
  this->m_target = other->m_target;
  this->m_index = other->m_index;
  Buffer::move(&this->m_seed,&other->m_seed);
  String::move(&this->m_extraNonce,&other->m_extraNonce);
  String::move(&this->m_poolWallet,&other->m_poolWallet);
  this->m_extraIters = other->m_extraIters;
  puVar3 = other->m_blob;
  puVar4 = this->m_blob;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)puVar4 = *(undefined8 *)puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -0x10 + 8;
    puVar4 = puVar4 + (ulong)bVar5 * -0x10 + 8;
  }
  other->m_size = 0;
  other->m_diff = 0;
  return;
}

Assistant:

void xmrig::Job::move(Job &&other)
{
    m_size       = other.m_size;
    m_clientId   = std::move(other.m_clientId);
    m_id         = std::move(other.m_id);
    m_backend    = other.m_backend;
    m_diff       = other.m_diff;
    m_height     = other.m_height;
    m_target     = other.m_target;
    m_index      = other.m_index;
    m_seed       = std::move(other.m_seed);
    m_extraNonce = std::move(other.m_extraNonce);
    m_poolWallet = std::move(other.m_poolWallet);
    m_extraIters = std::move(other.m_extraIters);

    memcpy(m_blob, other.m_blob, sizeof(m_blob));

    other.m_size        = 0;
    other.m_diff        = 0;
}